

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::anon_unknown_5::IsInstalledProtoPath
          (anon_unknown_5 *this,string_view path)

{
  int iVar1;
  string file_path;
  string local_90;
  AlphaNum local_70;
  anon_unknown_5 *local_40;
  size_t local_38;
  
  local_38 = path._M_len;
  local_70.piece_._M_len = 0x21;
  local_70.piece_._M_str = "/google/protobuf/descriptor.proto";
  local_40 = this;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_90,(lts_20250127 *)&local_40,&local_70,
             (AlphaNum *)"/google/protobuf/descriptor.proto");
  iVar1 = access(local_90._M_dataplus._M_p,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return iVar1 != -1;
}

Assistant:

bool IsInstalledProtoPath(absl::string_view path) {
  // Checking the descriptor.proto file should be good enough.
  std::string file_path =
      absl::StrCat(path, "/google/protobuf/descriptor.proto");
  return access(file_path.c_str(), F_OK) != -1;
}